

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-queue-foreach-delete.c
# Opt level: O0

int run_test_queue_foreach_delete(void)

{
  int iVar1;
  uv_loop_t *loop_00;
  int64_t eval_b_19;
  int64_t eval_a_19;
  int64_t eval_b_18;
  int64_t eval_a_18;
  int64_t eval_b_17;
  int64_t eval_a_17;
  int64_t eval_b_16;
  int64_t eval_a_16;
  int64_t eval_b_15;
  int64_t eval_a_15;
  int64_t eval_b_14;
  int64_t eval_a_14;
  int64_t eval_b_13;
  int64_t eval_a_13;
  int64_t eval_b_12;
  int64_t eval_a_12;
  int64_t eval_b_11;
  int64_t eval_a_11;
  int64_t eval_b_10;
  int64_t eval_a_10;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  ulong uStack_88;
  int r_3;
  size_t i_2;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  ulong uStack_58;
  int r_2;
  size_t i_1;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  ulong uStack_28;
  int r_1;
  size_t i;
  int r;
  uv_loop_t *loop;
  
  loop_00 = uv_default_loop();
  for (uStack_28 = 0; uStack_28 < 3; uStack_28 = uStack_28 + 1) {
    iVar1 = uv_idle_init(loop_00,idle + uStack_28);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-queue-foreach-delete.c"
              ,0xb0,"r","==","0",(long)iVar1,"==",0);
      abort();
    }
    iVar1 = uv_idle_start(idle + uStack_28,idle_cbs[uStack_28]);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-queue-foreach-delete.c"
              ,0xb0,"r","==","0",(long)iVar1,"==",0);
      abort();
    }
  }
  for (uStack_58 = 0; uStack_58 < 3; uStack_58 = uStack_58 + 1) {
    iVar1 = uv_prepare_init(loop_00,prepare + uStack_58);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-queue-foreach-delete.c"
              ,0xb1,"r","==","0",(long)iVar1,"==",0);
      abort();
    }
    iVar1 = uv_prepare_start(prepare + uStack_58,prepare_cbs[uStack_58]);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-queue-foreach-delete.c"
              ,0xb1,"r","==","0",(long)iVar1,"==",0);
      abort();
    }
  }
  for (uStack_88 = 0; uStack_88 < 3; uStack_88 = uStack_88 + 1) {
    iVar1 = uv_check_init(loop_00,check + uStack_88);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-queue-foreach-delete.c"
              ,0xb2,"r","==","0",(long)iVar1,"==",0);
      abort();
    }
    iVar1 = uv_check_start(check + uStack_88,check_cbs[uStack_88]);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-queue-foreach-delete.c"
              ,0xb2,"r","==","0",(long)iVar1,"==",0);
      abort();
    }
  }
  init_and_start_fs_events(loop_00);
  iVar1 = uv_timer_init(loop_00,&timer);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-queue-foreach-delete.c"
            ,0xb9,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_timer_start(&timer,helper_timer_cb,0,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-queue-foreach-delete.c"
            ,0xbc,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_run(loop_00,UV_RUN_NOWAIT);
  if ((long)iVar1 != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-queue-foreach-delete.c"
            ,0xc0,"1","==","r",1,"==",(long)iVar1);
    abort();
  }
  if ((ulong)idle_cb_calls[0] != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-queue-foreach-delete.c"
            ,0xc2,"1","==","idle_cb_calls[0]",1,"==",(ulong)idle_cb_calls[0]);
    abort();
  }
  if ((ulong)idle_cb_calls[1] != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-queue-foreach-delete.c"
            ,0xc2,"idle_cb_calls[1]","==","0",(ulong)idle_cb_calls[1],"==",0);
    abort();
  }
  if ((ulong)idle_cb_calls[2] != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-queue-foreach-delete.c"
            ,0xc2,"1","==","idle_cb_calls[2]",1,"==",(ulong)idle_cb_calls[2]);
    abort();
  }
  if ((ulong)prepare_cb_calls[0] != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-queue-foreach-delete.c"
            ,0xc3,"1","==","prepare_cb_calls[0]",1,"==",(ulong)prepare_cb_calls[0]);
    abort();
  }
  if ((ulong)prepare_cb_calls[1] != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-queue-foreach-delete.c"
            ,0xc3,"prepare_cb_calls[1]","==","0",(ulong)prepare_cb_calls[1],"==",0);
    abort();
  }
  if ((ulong)prepare_cb_calls[2] != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-queue-foreach-delete.c"
            ,0xc3,"1","==","prepare_cb_calls[2]",1,"==",(ulong)prepare_cb_calls[2]);
    abort();
  }
  if ((ulong)check_cb_calls[0] != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-queue-foreach-delete.c"
            ,0xc4,"1","==","check_cb_calls[0]",1,"==",(ulong)check_cb_calls[0]);
    abort();
  }
  if ((ulong)check_cb_calls[1] != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-queue-foreach-delete.c"
            ,0xc4,"check_cb_calls[1]","==","0",(ulong)check_cb_calls[1],"==",0);
    abort();
  }
  if ((ulong)check_cb_calls[2] != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-queue-foreach-delete.c"
            ,0xc4,"1","==","check_cb_calls[2]",1,"==",(ulong)check_cb_calls[2]);
    abort();
  }
  if ((ulong)helper_timer_cb_calls != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-queue-foreach-delete.c"
            ,199,"1","==","helper_timer_cb_calls",1,"==",(ulong)helper_timer_cb_calls);
    abort();
  }
  close_loop(loop_00);
  iVar1 = uv_loop_close(loop_00);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-queue-foreach-delete.c"
            ,0xca,"0","==","uv_loop_close(loop)",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(queue_foreach_delete) {
  uv_loop_t* loop;
  int r;

  loop = uv_default_loop();

  INIT_AND_START(idle,    loop);
  INIT_AND_START(prepare, loop);
  INIT_AND_START(check,   loop);

#ifdef __linux__
  init_and_start_fs_events(loop);

  /* helper timer to trigger async and fs_event callbacks */
  r = uv_timer_init(loop, &timer);
  ASSERT_OK(r);

  r = uv_timer_start(&timer, helper_timer_cb, 0, 0);
  ASSERT_OK(r);
#endif

  r = uv_run(loop, UV_RUN_NOWAIT);
  ASSERT_EQ(1, r);

  END_ASSERTS(idle);
  END_ASSERTS(prepare);
  END_ASSERTS(check);

#ifdef __linux__
  ASSERT_EQ(1, helper_timer_cb_calls);
#endif

  MAKE_VALGRIND_HAPPY(loop);

  return 0;
}